

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::getOffsetRange(TextureGatherCase *this)

{
  int iVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long in_RSI;
  
  iVar1 = *(int *)(in_RSI + 0x7c);
  if (iVar1 == 2) {
    plVar2 = *(long **)(*(long *)(in_RSI + 0x70) + 0x10);
    uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2,0x8e5e);
    plVar2 = *(long **)(*(long *)(in_RSI + 0x70) + 0x10);
    uVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,0x8e5f);
    *(undefined4 *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = uVar3;
    *(undefined4 *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4)
         = uVar4;
  }
  else if (iVar1 == 1) {
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x7fffffff8;
  }
  else if (iVar1 == 0) {
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  }
  else {
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0xffffffffffffffff;
  }
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 TextureGatherCase::getOffsetRange (void) const
{
	switch (m_offsetSize)
	{
		case OFFSETSIZE_NONE:
			return IVec2(0);
			break;

		case OFFSETSIZE_MINIMUM_REQUIRED:
			// \note Defined by spec.
			return IVec2(SPEC_MAX_MIN_OFFSET,
						 SPEC_MIN_MAX_OFFSET);
			break;

		case OFFSETSIZE_IMPLEMENTATION_MAXIMUM:
			return IVec2(m_context.getContextInfo().getInt(GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET),
						 m_context.getContextInfo().getInt(GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET));
			break;

		default:
			DE_ASSERT(false);
			return IVec2(-1);
	}
}